

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  VCCLCompilerTool *tool;
  XmlOutput *v;
  XmlOutput *values;
  XmlOutput *ch;
  XmlOutput *o;
  XmlOutput *this_00;
  XmlOutput *name;
  undefined4 in_register_00000034;
  xml_output *this_01;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffe938;
  QStringList *in_stack_ffffffffffffe940;
  QString *in_stack_ffffffffffffe948;
  char *in_stack_ffffffffffffe968;
  xml_output *in_stack_ffffffffffffe978;
  XmlOutput *in_stack_ffffffffffffe980;
  char *in_stack_ffffffffffffe9e8;
  
  this_01 = (xml_output *)CONCAT44(in_register_00000034,__fd);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(in_stack_ffffffffffffe938,in_stack_ffffffffffffe968);
  tag(in_stack_ffffffffffffe948);
  tool = (VCCLCompilerTool *)
         XmlOutput::operator<<(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  attrTagX(in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe940,(char *)tool);
  v = XmlOutput::operator<<(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  attrTagX(in_stack_ffffffffffffe9e8,(QStringList *)v,(char *)tool);
  values = XmlOutput::operator<<(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  attrTagX(in_stack_ffffffffffffe9e8,(QStringList *)v,(char *)tool);
  XmlOutput::operator<<(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  ::toString((asmListingOption)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  ::toString((basicRuntimeCheckOption)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  ch = XmlOutput::operator<<(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  toTriState(*(browseInfoOption *)((long)__buf + 0x70));
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  attrTagS((char *)tool,(QString *)this_01);
  o = XmlOutput::operator<<(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  this_00 = XmlOutput::operator<<(in_stack_ffffffffffffe980,(xml_output *)o);
  ::toString((callingConventionOption)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((CompileAsOptions)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((compileAsManagedOptions)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((debugOption)((ulong)tool >> 0x20),(DotNET)tool);
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagX(in_stack_ffffffffffffe9e8,(QStringList *)v,(char *)tool);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((enhancedInstructionSetOption)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((exceptionHandling)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  name = XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((favorSizeOrSpeedOption)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((floatingPointModel)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagX((char *)name,(QStringList *)v,(char *)tool);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagX((char *)name,(QStringList *)v,(char *)tool);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((inlineExpansionOption)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((optimizeOption)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((pchOption)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  unquote((QStringList *)values);
  attrTagX((char *)name,(QStringList *)v,(char *)tool);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  toTriState(*(preprocessOption *)((long)__buf + 0x128));
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  fixedProgramDataBaseFileNameOutput(tool);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((runtimeLibraryOption)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((structMemberAlignOption)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagX((char *)name,(QStringList *)v,(char *)tool);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagX((char *)name,(QStringList *)v,(char *)tool);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  ::toString((warningLevelOption)((ulong)tool >> 0x20));
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)tool >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagS((char *)tool,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString((QString *)tool,(char *)ch);
  closetag((QString *)values);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243bbd);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243bf1);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243c73);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243cc1);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QList<QString>::~QList((QList<QString> *)0x243d1c);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243d5d);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243d77);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243e06);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243e6e);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243e95);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243ebc);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243efd);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243f31);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243f65);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243f7f);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243f99);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243fda);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x243ff4);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x244042);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCCLCompilerTool &tool)
{
    xml
        << tag(_CLCompile)
            << attrTagX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagX(_AdditionalUsingDirectories, tool.AdditionalUsingDirectories, ";")
            << attrTagS(_AssemblerListingLocation, tool.AssemblerListingLocation)
            << attrTagS(_AssemblerOutput, toString(tool.AssemblerOutput))
            << attrTagS(_BasicRuntimeChecks, toString(tool.BasicRuntimeChecks))
            << attrTagT(_BrowseInformation, toTriState(tool.BrowseInformation))
            << attrTagS(_BrowseInformationFile, tool.BrowseInformationFile)
            << attrTagT(_BufferSecurityCheck, tool.BufferSecurityCheck)
            << attrTagS(_CallingConvention, toString(tool.CallingConvention))
            << attrTagS(_CompileAs, toString(tool.CompileAs))
            << attrTagS(_CompileAsManaged, toString(tool.CompileAsManaged))
            << attrTagT(_CompileAsWinRT, tool.CompileAsWinRT)
            << attrTagT(_CreateHotpatchableImage, tool.CreateHotpatchableImage)
            << attrTagS(_DebugInformationFormat, toString(tool.DebugInformationFormat,
                                                          tool.config->CompilerVersion))
            << attrTagT(_DisableLanguageExtensions, tool.DisableLanguageExtensions)
            << attrTagX(_DisableSpecificWarnings, tool.DisableSpecificWarnings, ";")
            << attrTagS(_EnableEnhancedInstructionSet, toString(tool.EnableEnhancedInstructionSet))
            << attrTagT(_EnableFiberSafeOptimizations, tool.EnableFiberSafeOptimizations)
            << attrTagT(_EnablePREfast, tool.EnablePREfast)
            << attrTagS(_ErrorReporting, tool.ErrorReporting)
            << attrTagS(_ExceptionHandling, toString(tool.ExceptionHandling))
            << attrTagT(_ExpandAttributedSource, tool.ExpandAttributedSource)
            << attrTagS(_FavorSizeOrSpeed, toString(tool.FavorSizeOrSpeed))
            << attrTagT(_FloatingPointExceptions, tool.FloatingPointExceptions)
            << attrTagS(_FloatingPointModel, toString(tool.FloatingPointModel))
            << attrTagT(_ForceConformanceInForLoopScope, tool.ForceConformanceInForLoopScope)
            << attrTagX(_ForcedIncludeFiles, tool.ForcedIncludeFiles, ";")
            << attrTagX(_ForcedUsingFiles, tool.ForcedUsingFiles, ";")
            << attrTagT(_FunctionLevelLinking, tool.EnableFunctionLevelLinking)
            << attrTagT(_GenerateXMLDocumentationFiles, tool.GenerateXMLDocumentationFiles)
            << attrTagT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
            << attrTagS(_InlineFunctionExpansion, toString(tool.InlineFunctionExpansion))
            << attrTagT(_IntrinsicFunctions, tool.EnableIntrinsicFunctions)
            << attrTagT(_MinimalRebuild, tool.MinimalRebuild)
            << attrTagT(_MultiProcessorCompilation, tool.MultiProcessorCompilation)
            << attrTagS(_LanguageStandard, tool.LanguageStandard)
            << attrTagS(_LanguageStandard_C, tool.LanguageStandard_C)
            << attrTagS(_ObjectFileName, tool.ObjectFile)
            << attrTagT(_OmitDefaultLibName, tool.OmitDefaultLibName)
            << attrTagT(_OmitFramePointers, tool.OmitFramePointers)
            << attrTagT(_OpenMPSupport, tool.OpenMP)
            << attrTagS(_Optimization, toString(tool.Optimization))
            << attrTagS(_PrecompiledHeader, toString(tool.UsePrecompiledHeader))
            << attrTagS(_PrecompiledHeaderFile, tool.PrecompiledHeaderThrough)
            << attrTagS(_PrecompiledHeaderOutputFile, tool.PrecompiledHeaderFile)
            << attrTagT(_PreprocessKeepComments, tool.KeepComments)
            << attrTagX(_PreprocessorDefinitions, unquote(tool.PreprocessorDefinitions), ";")
            << attrTagS(_PreprocessOutputPath, tool.PreprocessOutputPath)
            << attrTagT(_PreprocessSuppressLineNumbers, tool.PreprocessSuppressLineNumbers)
            << attrTagT(_PreprocessToFile, toTriState(tool.GeneratePreprocessedFile))
            << fixedProgramDataBaseFileNameOutput(tool)
            << attrTagS(_ProcessorNumber, tool.MultiProcessorCompilationProcessorCount)
            << attrTagS(_RuntimeLibrary, toString(tool.RuntimeLibrary))
            << attrTagT(_RuntimeTypeInfo, tool.RuntimeTypeInfo)
            << attrTagT(_ShowIncludes, tool.ShowIncludes)
            << attrTagT(_SmallerTypeCheck, tool.SmallerTypeCheck)
            << attrTagT(_StringPooling, tool.StringPooling)
            << attrTagS(_StructMemberAlignment, toString(tool.StructMemberAlignment))
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
            << attrTagX(_TreatSpecificWarningsAsErrors, tool.TreatSpecificWarningsAsErrors, ";")
            << attrTagT(_TreatWarningAsError, tool.WarnAsError)
            << attrTagT(_TreatWChar_tAsBuiltInType, tool.TreatWChar_tAsBuiltInType)
            << attrTagT(_UndefineAllPreprocessorDefinitions, tool.UndefineAllPreprocessorDefinitions)
            << attrTagX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions, ";")
            << attrTagT(_UseFullPaths, tool.DisplayFullPaths)
            << attrTagT(_UseUnicodeForAssemblerListing, tool.UseUnicodeForAssemblerListing)
            << attrTagS(_WarningLevel, toString(tool.WarningLevel))
            << attrTagT(_WholeProgramOptimization, tool.WholeProgramOptimization)
            << attrTagS(_XMLDocumentationFileName, tool.XMLDocumentationFileName)
        << closetag(_CLCompile);
}